

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strstr_s.c
# Opt level: O2

errno_t strstr_s(char *dest,rsize_t dmax,char *src,rsize_t slen,char **substring)

{
  long lVar1;
  code *pcVar2;
  errno_t error;
  errno_t eVar3;
  char *msg;
  long lVar4;
  rsize_t rVar5;
  long in_FS_OFFSET;
  bool bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (substring == (char **)0x0) {
    msg = "strstr_s: substring is null";
LAB_00106664:
    eVar3 = 400;
    error = 400;
  }
  else {
    *substring = (char *)0x0;
    if (dest == (char *)0x0) {
      msg = "strstr_s: dest is null";
      goto LAB_00106664;
    }
    if (dmax == 0) {
      msg = "strstr_s: dmax is 0";
LAB_00106679:
      eVar3 = 0x191;
      error = 0x191;
    }
    else {
      if (dmax < 0x10000001) {
        if (src == (char *)0x0) {
          msg = "strstr_s: src is null";
          goto LAB_00106664;
        }
        if (slen == 0) {
          msg = "strstr_s: slen is 0";
          goto LAB_00106679;
        }
        if (slen < 0x10000001) {
          if ((dest == src) || (*src == '\0')) {
LAB_00106746:
            *substring = dest;
            eVar3 = 0;
          }
          else {
            while( true ) {
              eVar3 = 0x199;
              if ((dmax == 0) || (*dest == '\0')) break;
              lVar4 = 0x100000000;
              rVar5 = 0;
              while (((src[rVar5] != '\0' && (dmax != rVar5)) && (dest[rVar5] == src[rVar5]))) {
                if (rVar5 == 0x7fffffff) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                if (src[lVar4 >> 0x20] == '\0') goto LAB_00106746;
                lVar4 = lVar4 + 0x100000000;
                bVar6 = slen - 1 == rVar5;
                rVar5 = rVar5 + 1;
                if (bVar6) goto LAB_00106746;
              }
              dest = dest + 1;
              dmax = dmax - 1;
            }
          }
          goto LAB_0010668a;
        }
        msg = "strstr_s: slen exceeds max";
      }
      else {
        msg = "strstr_s: dmax exceeds max";
      }
      eVar3 = 0x193;
      error = 0x193;
    }
  }
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_0010668a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return eVar3;
}

Assistant:

errno_t
strstr_s (char *dest, rsize_t dmax,
          const char *src, rsize_t slen, char **substring)
{
    rsize_t len;
    rsize_t dlen;
    int i;

    if (substring == NULL) {
        invoke_safe_str_constraint_handler("strstr_s: substring is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }
    *substring = NULL;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strstr_s: dest is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strstr_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strstr_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strstr_s: src is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (slen == 0) {
        invoke_safe_str_constraint_handler("strstr_s: slen is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (slen > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strstr_s: slen exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    /*
     * src points to a string with zero length, or
     * src equals dest, return dest
     */
    if (*src == '\0' || dest == src) {
        *substring = dest;
        return RCNEGATE(EOK);
    }

    while (dmax && *dest) {
        i = 0;
        len = slen;
        dlen = dmax;

        while (src[i] && dlen) {

            /* not a match, not a substring */
            if (dest[i] != src[i]) {
                break;
            }

            /* move to the next char */
            i++;
            len--;
            dlen--;

            if (src[i] == '\0' || !len) {
                *substring = dest;
                return RCNEGATE(EOK);
            }
        }
        dest++;
        dmax--;
    }

    /*
     * substring was not found, return NULL
     */
    *substring = NULL;
    return RCNEGATE(ESNOTFND);
}